

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_internal.cpp
# Opt level: O0

void cfd::TransactionContextUtil::AddPubkeyHashSign<cfd::ConfidentialTransactionContext>
               (ConfidentialTransactionContext *transaction,OutPoint *outpoint,
               SignParameter *signature,Pubkey *pubkey,AddressType address_type)

{
  SignDataType SVar1;
  undefined8 uVar2;
  ulong uVar3;
  CfdException *this;
  SignParameter *in_RDX;
  CfdError in_R8D;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> scriptsig;
  bool in_stack_0000018e;
  bool in_stack_0000018f;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *in_stack_00000190;
  OutPoint *in_stack_00000198;
  ConfidentialTransactionContext *in_stack_000001a0;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_params;
  Script locking_script;
  bool has_scriptsig;
  bool has_witness;
  value_type *in_stack_fffffffffffffcd8;
  undefined7 in_stack_fffffffffffffce0;
  byte in_stack_fffffffffffffce7;
  value_type *in_stack_fffffffffffffce8;
  string *in_stack_fffffffffffffcf0;
  allocator *message;
  undefined4 in_stack_fffffffffffffcf8;
  CfdError in_stack_fffffffffffffcfc;
  CfdError CVar4;
  SignParameter *in_stack_fffffffffffffd00;
  allocator local_1c1;
  string local_1c0 [32];
  char *local_1a0;
  undefined4 local_198;
  char *local_190;
  Script local_188;
  Script local_138;
  byte local_fc;
  byte local_fb;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [32];
  char *local_d8;
  undefined4 local_d0;
  char *local_c8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  char *local_98;
  undefined4 local_90;
  char *local_88;
  undefined1 local_7d;
  allocator local_69;
  string local_68 [36];
  SignDataType local_44;
  char *local_40;
  undefined4 local_38;
  char *local_30;
  CfdError local_24;
  SignParameter *local_18;
  
  local_24 = in_R8D;
  local_18 = in_RDX;
  SVar1 = SignParameter::GetDataType(in_RDX);
  if ((SVar1 != kSign) && (SVar1 = SignParameter::GetDataType(local_18), SVar1 != kBinary)) {
    local_40 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_transaction_internal.cpp"
                       ,0x2f);
    local_40 = local_40 + 1;
    local_38 = 100;
    local_30 = "AddPubkeyHashSign";
    local_44 = SignParameter::GetDataType(local_18);
    core::logger::warn<cfd::SignDataType>
              ((CfdSourceLocation *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
               (char *)in_stack_fffffffffffffcd8,(SignDataType *)0x3a4971);
    local_7d = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_68,"Invalid signature type. signature type must be \"kSign\" or \"kBinary\".",
               &local_69);
    core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
               in_stack_fffffffffffffcf0);
    local_7d = 0;
    __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  uVar3 = cfd::core::Pubkey::IsValid();
  if ((uVar3 & 1) == 0) {
    local_98 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_transaction_internal.cpp"
                       ,0x2f);
    local_98 = local_98 + 1;
    local_90 = 0x6d;
    local_88 = "AddPubkeyHashSign";
    core::logger::warn<>
              ((CfdSourceLocation *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
               (char *)in_stack_fffffffffffffcd8);
    local_ba = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"Invalid pubkey.",&local_b9);
    core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
               in_stack_fffffffffffffcf0);
    local_ba = 0;
    __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  uVar3 = cfd::core::OutPoint::IsValid();
  if ((uVar3 & 1) != 0) {
    local_fb = 0;
    local_fc = 0;
    cfd::core::Script::Script(&local_138);
    std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
              ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)0x3a4cfc);
    CVar4 = local_24;
    if (local_24 == kCfdIllegalStateError) {
      local_fc = 1;
    }
    else if (local_24 == kCfdInvalidSettingError) {
      local_fb = 1;
    }
    else {
      if (local_24 != kCfdDiskAccessError) {
        local_1a0 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_transaction_internal.cpp"
                            ,0x2f);
        local_1a0 = local_1a0 + 1;
        local_198 = 0x88;
        local_190 = "AddPubkeyHashSign";
        core::logger::warn<cfd::core::AddressType&>
                  ((CfdSourceLocation *)
                   CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                   (char *)in_stack_fffffffffffffcd8,(AddressType *)0x3a4e26);
        uVar2 = __cxa_allocate_exception(0x30);
        message = &local_1c1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_1c0,
                   "Invalid address_type. address_type must be \"p2wpkh\" or \"p2sh-p2wpkh\" or \"p2pkh\"."
                   ,message);
        core::CfdException::CfdException
                  ((CfdException *)in_stack_fffffffffffffd00,local_24,(string *)message);
        __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      local_fb = 1;
      local_fc = 1;
      cfd::core::ScriptUtil::CreateP2wpkhLockingScript((Pubkey *)&local_188);
      cfd::core::Script::operator=(&local_138,&local_188);
      core::Script::~Script((Script *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0))
      ;
      CVar4 = local_24;
    }
    std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
              ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
               in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    SignParameter::SignParameter
              (in_stack_fffffffffffffd00,(Pubkey *)CONCAT44(CVar4,in_stack_fffffffffffffcf8));
    std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
              ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
               CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
               in_stack_fffffffffffffcd8);
    SignParameter::~SignParameter
              ((SignParameter *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    if ((local_fb & 1) != 0) {
      AddSign<cfd::ConfidentialTransactionContext>
                (in_stack_000001a0,in_stack_00000198,in_stack_00000190,in_stack_0000018f,
                 in_stack_0000018e);
    }
    if ((local_fc & 1) != 0) {
      in_stack_fffffffffffffce7 = cfd::core::Script::IsEmpty();
      if ((in_stack_fffffffffffffce7 & 1) == 0) {
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
                  ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)0x3a4ff1);
        SignParameter::SignParameter
                  (in_stack_fffffffffffffd00,(Script *)CONCAT44(CVar4,in_stack_fffffffffffffcf8));
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                  ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                   CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                   in_stack_fffffffffffffcd8);
        SignParameter::~SignParameter
                  ((SignParameter *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
        AddSign<cfd::ConfidentialTransactionContext>
                  (in_stack_000001a0,in_stack_00000198,in_stack_00000190,in_stack_0000018f,
                   in_stack_0000018e);
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
                  ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                   in_stack_fffffffffffffcf0);
      }
      else {
        AddSign<cfd::ConfidentialTransactionContext>
                  (in_stack_000001a0,in_stack_00000198,in_stack_00000190,in_stack_0000018f,
                   in_stack_0000018e);
      }
    }
    std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
              ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
               in_stack_fffffffffffffcf0);
    core::Script::~Script((Script *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    return;
  }
  local_d8 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_transaction_internal.cpp"
                     ,0x2f);
  local_d8 = local_d8 + 1;
  local_d0 = 0x71;
  local_c8 = "AddPubkeyHashSign";
  core::logger::warn<>
            ((CfdSourceLocation *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
             (char *)in_stack_fffffffffffffcd8);
  local_fa = 1;
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"Invalid outpoint.",&local_f9);
  core::CfdException::CfdException(this,in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf0);
  local_fa = 0;
  __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void TransactionContextUtil::AddPubkeyHashSign(
    Tx* transaction, const OutPoint& outpoint, const SignParameter& signature,
    const Pubkey& pubkey, AddressType address_type) {
  if ((signature.GetDataType() != SignDataType::kSign) &&
      (signature.GetDataType() != SignDataType::kBinary)) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to AddPubkeyHashSign. Invalid signature type: {}",
        signature.GetDataType());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid signature type. signature type must be \"kSign\" "
        "or \"kBinary\".");  // NOLINT
  }
  if (!pubkey.IsValid()) {
    warn(CFD_LOG_SOURCE, "Failed to AddPubkeyHashSign. Invalid pubkey.");
    throw CfdException(CfdError::kCfdIllegalArgumentError, "Invalid pubkey.");
  }
  if (!outpoint.IsValid()) {
    warn(CFD_LOG_SOURCE, "Failed to AddPubkeyHashSign. Invalid outpoint.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid outpoint.");
  }

  bool has_witness = false;
  bool has_scriptsig = false;
  Script locking_script;
  std::vector<SignParameter> sign_params;
  switch (address_type) {
    case AddressType::kP2wpkhAddress:
      has_witness = true;
      break;
    case AddressType::kP2shP2wpkhAddress:
      has_witness = true;
      has_scriptsig = true;
      locking_script = ScriptUtil::CreateP2wpkhLockingScript(pubkey);
      break;
    case AddressType::kP2pkhAddress:
      has_scriptsig = true;
      break;
    default:
      warn(
          CFD_LOG_SOURCE,
          "Failed to AddPubkeyHashSign. Invalid address_type: {}",
          address_type);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid address_type. address_type must be \"p2wpkh\" "
          "or \"p2sh-p2wpkh\" or \"p2pkh\".");  // NOLINT
  }
  sign_params.push_back(signature);
  sign_params.push_back(SignParameter(pubkey));

  if (has_witness) {
    AddSign(transaction, outpoint, sign_params, true, true);
  }
  if (has_scriptsig) {
    if (!locking_script.IsEmpty()) {  // p2sh-p2wpkh
      std::vector<SignParameter> scriptsig;
      scriptsig.push_back(SignParameter(locking_script));
      AddSign(transaction, outpoint, scriptsig, false, true);
    } else {
      AddSign(transaction, outpoint, sign_params, false, true);
    }
  }
}